

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void findmust(parse *p,re_guts *g)

{
  ulong uVar1;
  uint uVar2;
  char *pcVar3;
  ulong *puVar4;
  sop *psVar5;
  bool local_59;
  long local_50;
  sopno i;
  char *cp;
  sop s;
  sop *psStack_30;
  int newlen;
  sop *newstart;
  sop *start;
  sop *scan;
  re_guts *g_local;
  parse *p_local;
  
  if (p->error == 0) {
    s._4_4_ = 0;
    start = g->strip + 1;
    do {
      puVar4 = (ulong *)(start + 1);
      cp = (char *)*start;
      uVar2 = (uint)cp & 0x7c000000;
      if (uVar2 == 0x8000000) {
        if (s._4_4_ == 0) {
          psStack_30 = start;
        }
        s._4_4_ = s._4_4_ + 1;
      }
      else if (uVar2 != 0x24000000) {
        if (uVar2 == 0x2c000000) {
LAB_00102ecd:
          do {
            start = start + ((ulong)cp & 0x3ffffff);
            cp = (char *)*start;
            if (((((ulong)cp & 0x7c000000) != 0x30000000) &&
                (((ulong)cp & 0x7c000000) != 0x48000000)) &&
               (((ulong)cp & 0x7c000000) != 0x44000000)) {
              g->iflags = g->iflags | 4;
              return;
            }
            local_59 = ((ulong)cp & 0x7c000000) != 0x30000000 &&
                       ((ulong)cp & 0x7c000000) != 0x48000000;
            puVar4 = (ulong *)start;
          } while (local_59);
        }
        else {
          if ((uVar2 == 0x34000000) || (uVar2 == 0x38000000)) goto LAB_00102f99;
          if (uVar2 == 0x3c000000) goto LAB_00102ecd;
        }
        start = (sop *)puVar4;
        if (g->mlen < s._4_4_) {
          newstart = psStack_30;
          g->mlen = s._4_4_;
        }
        s._4_4_ = 0;
        puVar4 = (ulong *)start;
      }
LAB_00102f99:
      start = (sop *)puVar4;
    } while (((ulong)cp & 0x7c000000) != 0x4000000);
    if (g->mlen != 0) {
      pcVar3 = (char *)malloc((long)g->mlen + 1);
      g->must = pcVar3;
      if (g->must == (char *)0x0) {
        g->mlen = 0;
      }
      else {
        start = newstart;
        i = (sopno)g->must;
        for (local_50 = (long)g->mlen; 0 < local_50; local_50 = local_50 + -1) {
          do {
            psVar5 = start + 1;
            uVar1 = *start;
            start = psVar5;
          } while ((uVar1 & 0x7c000000) != 0x8000000);
          if (g->must + g->mlen <= (ulong)i) {
            __assert_fail("cp < g->must + g->mlen",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x68f,"void findmust()");
          }
          *(char *)i = (char)uVar1;
          i = i + 1;
        }
        if ((char *)i != g->must + g->mlen) {
          __assert_fail("cp == g->must + g->mlen",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x692,"void findmust()");
        }
        *(undefined1 *)i = 0;
      }
    }
  }
  return;
}

Assistant:

static void
findmust(p, g)
struct parse *p;
struct re_guts *g;
{
	sop *scan;
	sop *start;
	sop *newstart;
	int newlen;
	sop s;
	char *cp;
	sopno i;

	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	/* find the longest OCHAR sequence in strip */
	newlen = 0;
	scan = g->strip + 1;
	do {
		s = *scan++;
		switch (OP(s)) {
		case OCHAR:		/* sequence member */
			if (newlen == 0)		/* new sequence */
				newstart = scan - 1;
			newlen++;
			break;
		case OPLUS_:		/* things that don't break one */
		case OLPAREN:
		case ORPAREN:
			break;
		case OQUEST_:		/* things that must be skipped */
		case OCH_:
			scan--;
			do {
				scan += OPND(s);
				s = *scan;
				/* assert() interferes w debug printouts */
				if (OP(s) != O_QUEST && OP(s) != O_CH &&
							OP(s) != OOR2) {
					g->iflags |= BAD;
					return;
				}
			} while (OP(s) != O_QUEST && OP(s) != O_CH);
			/* fallthrough */
		default:		/* things that break a sequence */
			if (newlen > g->mlen) {		/* ends one */
				start = newstart;
				g->mlen = newlen;
			}
			newlen = 0;
			break;
		}
	} while (OP(s) != OEND);

	if (g->mlen == 0)		/* there isn't one */
		return;

	/* turn it into a character string */
	g->must = malloc((size_t)g->mlen + 1);
	if (g->must == NULL) {		/* argh; just forget it */
		g->mlen = 0;
		return;
	}
	cp = g->must;
	scan = start;
	for (i = g->mlen; i > 0; i--) {
		while (OP(s = *scan++) != OCHAR)
			continue;
		assert(cp < g->must + g->mlen);
		*cp++ = (char)OPND(s);
	}
	assert(cp == g->must + g->mlen);
	*cp++ = '\0';		/* just on general principles */
}